

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

void __thiscall
Json::OurReader::getLocationLineAndColumn(OurReader *this,Location location,int *line,int *column)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar2 = this->begin_;
  *line = 0;
  pcVar4 = pcVar2;
  if (pcVar2 < location) {
    do {
      iVar1 = (int)pcVar2;
      if (pcVar4 == this->end_) break;
      pcVar3 = pcVar4 + 1;
      if (*pcVar4 == '\n') {
LAB_0012d230:
        pcVar2 = pcVar3;
        *line = *line + 1;
        pcVar3 = pcVar2;
      }
      else if (*pcVar4 == '\r') {
        if ((pcVar3 != this->end_) && (pcVar4[1] == '\n')) {
          pcVar3 = pcVar4 + 2;
        }
        goto LAB_0012d230;
      }
      iVar1 = (int)pcVar2;
      pcVar4 = pcVar3;
    } while (pcVar3 < location);
  }
  else {
    iVar1 = (int)pcVar2;
  }
  *column = ((int)location - iVar1) + 1;
  *line = *line + 1;
  return;
}

Assistant:

void OurReader::getLocationLineAndColumn(Location location, int& line,
                                         int& column) const {
  Location current = begin_;
  Location lastLineStart = current;
  line = 0;
  while (current < location && current != end_) {
    Char c = *current++;
    if (c == '\r') {
      if (current != end_ && *current == '\n')
        ++current;
      lastLineStart = current;
      ++line;
    } else if (c == '\n') {
      lastLineStart = current;
      ++line;
    }
  }
  // column & line start at 1
  column = int(location - lastLineStart) + 1;
  ++line;
}